

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgabc(int tfields,char **tform,int space,long *rowlen,long *tbcol,int *status)

{
  long *in_RCX;
  int in_EDX;
  int in_EDI;
  undefined8 *in_R8;
  int *in_R9;
  long width;
  int decims;
  int datacode;
  int ii;
  int *in_stack_00000098;
  int *in_stack_000000a0;
  long *in_stack_000000a8;
  int *in_stack_000000b0;
  char *in_stack_000000b8;
  long local_48;
  int local_34;
  int local_4;
  
  if (*in_R9 < 1) {
    *in_RCX = 0;
    if (in_EDI < 1) {
      local_4 = *in_R9;
    }
    else {
      *in_R8 = 1;
      for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
        in_R8[local_34] = *in_RCX + 1;
        ffasfm(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
               in_stack_00000098);
        *in_RCX = local_48 + in_EDX + *in_RCX;
      }
      *in_RCX = *in_RCX - (long)in_EDX;
      local_4 = *in_R9;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffgabc(int tfields,     /* I - number of columns in the table           */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           int space,       /* I - number of spaces to leave between cols   */
           long *rowlen,    /* O - total width of a table row               */
           long *tbcol,     /* O - starting byte in row for each column     */
           int *status)     /* IO - error status                            */
/*
  calculate the starting byte offset of each column of an ASCII table
  and the total length of a row, in bytes.  The input space value determines
  how many blank spaces to leave between each column (1 is recommended).
*/
{
    int ii, datacode, decims;
    long width;

    if (*status > 0)
        return(*status);

    *rowlen=0;

    if (tfields <= 0)
        return(*status);

    tbcol[0] = 1;

    for (ii = 0; ii < tfields; ii++)
    {
        tbcol[ii] = *rowlen + 1;    /* starting byte in row of column */

        ffasfm(tform[ii], &datacode, &width, &decims, status);

        *rowlen += (width + space);  /* total length of row */
    }

    *rowlen -= space;  /*  don't add space after the last field */

    return (*status);
}